

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O2

int ptls_fusion_aesgcm_decrypt
              (ptls_fusion_aesgcm_context_t *_ctx,void *output,void *input,size_t inlen,__m128i ctr,
              void *_aad,size_t aadlen,void *tag)

{
  __m128i X;
  undefined8 uVar1;
  longlong lVar2;
  bool bVar3;
  bool bVar4;
  longlong *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  __m128i *palVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  ulong uVar13;
  ulong l;
  long lVar14;
  long lVar15;
  __m128i alVar16;
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  __m128i alVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  __m128i *local_1d0;
  undefined1 (*local_1c0) [16];
  void *local_1b0;
  undefined1 local_198 [16];
  longlong local_e8;
  longlong lStack_e0;
  undefined1 local_d8 [16];
  __m128i gdatabuf [6];
  ptls_fusion_gfmul_state128 gstate;
  
  gstate.mid[0] = 0;
  gstate.mid[1] = 0;
  gstate.hi[0] = 0;
  gstate.hi[1] = 0;
  gstate.lo[0] = 0;
  gstate.lo[1] = 0;
  auVar21 = vpunpcklqdq_avx(ZEXT416((uint)((int)inlen * 8)),ZEXT416((uint)((int)ctr[1] * 8)));
  X = (__m128i)vpshufb_avx(auVar21,_DAT_001236c0);
  auVar21 = vpaddq_avx(in_ZMM0._0_16_,_DAT_001236e0);
  auVar17 = ZEXT1664(auVar21);
  auVar21 = vpshufb_avx(auVar21,_DAT_001236d0);
  auVar19 = ZEXT1664(auVar21 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
  lVar6 = (ctr[1] * 2 + 0x1eU & 0xffffffffffffffe0) + (inlen * 2 + 0x1e & 0xffffffffffffffe0) +
          0x240;
  bVar4 = true;
  bVar3 = true;
  lVar14 = 1;
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
  auVar23 = ZEXT1664(_DAT_001236d0);
  auVar29 = ZEXT1664((undefined1  [16])0x0);
  auVar31 = ZEXT1664((undefined1  [16])0x0);
  auVar22 = ZEXT1664((undefined1  [16])0x0);
  auVar25 = ZEXT1664((undefined1  [16])0x0);
  local_d8 = (undefined1  [16])0x0;
  l = inlen;
  local_1d0 = (__m128i *)output;
  local_1c0 = (undefined1 (*) [16])input;
  local_1b0 = (void *)ctr[0];
LAB_00115f4d:
  uVar8 = (ulong)(_ctx->ecb).rounds;
  palVar10 = (__m128i *)input;
  do {
    lVar7 = lVar6;
    local_198 = auVar17._0_16_;
    auVar17 = ZEXT1664((undefined1  [16])alVar20);
    input = palVar10;
    if (ctr[1] == 0) {
      if (l < 0x60) {
        uVar9 = 0;
LAB_00116366:
        palVar10 = gdatabuf + uVar9;
        while (alVar20 = auVar17._0_16_, uVar9 < 6) {
          if (l < 0x10) {
            if (l != 0) {
              loadn128(input,l);
              auVar22 = ZEXT1664(auVar22._0_16_);
              auVar31 = ZEXT1664(auVar31._0_16_);
              auVar29 = ZEXT1664(auVar29._0_16_);
              auVar27 = ZEXT1664(auVar27._0_16_);
              auVar25 = ZEXT1664(auVar25._0_16_);
              auVar23 = ZEXT1664(_DAT_001236d0);
              auVar19 = ZEXT1664(auVar19._0_16_);
              uVar9 = uVar9 + 1;
              *palVar10 = alVar20;
              alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
              input = (void *)((long)*(__m128i *)input + l);
            }
            if ((uVar9 < 6) && (bVar4)) {
              local_e8 = X[0];
              lStack_e0 = X[1];
              gdatabuf[uVar9][0] = local_e8;
              gdatabuf[uVar9][1] = lStack_e0;
              alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
              bVar4 = false;
              uVar9 = uVar9 + 1;
            }
            palVar10 = gdatabuf;
            l = 0;
            goto LAB_00115f94;
          }
          plVar5 = *(__m128i *)input;
          lVar2 = (*(__m128i *)input)[1];
          input = (void *)((long)input + 0x10);
          uVar9 = uVar9 + 1;
          (*palVar10)[0] = *plVar5;
          (*palVar10)[1] = lVar2;
          auVar21 = vpmovsxbq_avx(ZEXT216(1));
          auVar17 = ZEXT1664(auVar21);
          palVar10 = palVar10 + 1;
          l = l - 0x10;
        }
        ctr[1] = 0;
        goto LAB_001163bb;
      }
      input = palVar10 + 6;
      l = l - 0x60;
      uVar9 = 6;
LAB_00115f94:
      ctr[1] = 0;
      lVar12 = lVar14;
    }
    else {
      lVar6 = 0;
      uVar9 = 0;
      while (alVar20 = auVar17._0_16_, uVar9 != 6) {
        if ((ulong)ctr[1] < 0x10) {
          local_1b0 = (void *)((long)local_1b0 + lVar6);
          if (ctr[1] == 0) {
            lVar14 = lVar14 + uVar9;
          }
          else {
            loadn128(local_1b0,ctr[1]);
            auVar22 = ZEXT1664(auVar22._0_16_);
            auVar31 = ZEXT1664(auVar31._0_16_);
            auVar29 = ZEXT1664(auVar29._0_16_);
            auVar27 = ZEXT1664(auVar27._0_16_);
            auVar25 = ZEXT1664(auVar25._0_16_);
            auVar23 = ZEXT1664(_DAT_001236d0);
            auVar19 = ZEXT1664(auVar19._0_16_);
            *(__m128i *)((long)gdatabuf[0] + lVar6) = alVar20;
            auVar21 = vpmovsxbq_avx(ZEXT216(1));
            auVar17 = ZEXT1664(auVar21);
            lVar14 = lVar14 + uVar9 + 1;
            uVar9 = uVar9 + 1;
          }
          goto LAB_00116366;
        }
        uVar1 = ((undefined8 *)((long)local_1b0 + lVar6))[1];
        uVar9 = uVar9 + 1;
        *(undefined8 *)((long)gdatabuf[0] + lVar6) = *(undefined8 *)((long)local_1b0 + lVar6);
        *(undefined8 *)((long)gdatabuf[0] + lVar6 + 8) = uVar1;
        auVar21 = vpmovsxbq_avx(ZEXT216(1));
        auVar17 = ZEXT1664(auVar21);
        lVar6 = lVar6 + 0x10;
        ctr[1] = ctr[1] - 0x10;
      }
      local_1b0 = (void *)((long)local_1b0 + lVar6);
      lVar14 = lVar14 + 6;
      uVar9 = 6;
LAB_001163bb:
      palVar10 = gdatabuf;
      lVar12 = lVar14;
    }
    auVar21 = auVar23._0_16_;
    if (lVar12 == 0) {
      local_198 = vpaddq_avx(local_198,(undefined1  [16])alVar20);
      auVar18 = vpshufb_avx(local_198,auVar21);
      alVar16 = *(__m128i *)&(_ctx->ecb).keys;
      auVar19 = ZEXT1664((undefined1  [16])alVar16 ^ auVar18);
LAB_00115fe2:
      local_198 = vpaddq_avx(local_198,(undefined1  [16])alVar20);
      auVar18 = vpshufb_avx(local_198,auVar21);
      auVar25 = ZEXT1664((undefined1  [16])alVar16 ^ auVar18);
LAB_00115ff3:
      local_198 = vpaddq_avx(local_198,(undefined1  [16])alVar20);
      auVar18 = vpshufb_avx(local_198,auVar21);
      auVar27 = ZEXT1664((undefined1  [16])alVar16 ^ auVar18);
LAB_00116004:
      local_198 = vpaddq_avx(local_198,(undefined1  [16])alVar20);
      auVar18 = vpshufb_avx(local_198,auVar21);
      auVar29 = ZEXT1664((undefined1  [16])alVar16 ^ auVar18);
LAB_00116015:
      local_198 = vpaddq_avx(local_198,(undefined1  [16])alVar20);
      auVar18 = vpshufb_avx(local_198,auVar21);
      auVar31 = ZEXT1664((undefined1  [16])alVar16 ^ auVar18);
LAB_00116026:
      local_198 = vpaddq_avx(local_198,(undefined1  [16])alVar20);
      auVar21 = vpshufb_avx(local_198,auVar21);
      auVar22 = ZEXT1664((undefined1  [16])alVar16 ^ auVar21);
    }
    else {
      switch(lVar12) {
      case 1:
        alVar16 = *(__m128i *)&(_ctx->ecb).keys;
        alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
        goto LAB_00115fe2;
      case 2:
        alVar16 = *(__m128i *)&(_ctx->ecb).keys;
        alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
        goto LAB_00115ff3;
      case 3:
        alVar16 = *(__m128i *)&(_ctx->ecb).keys;
        alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
        goto LAB_00116004;
      case 4:
        alVar16 = *(__m128i *)&(_ctx->ecb).keys;
        alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
        goto LAB_00116015;
      case 5:
        alVar16 = (_ctx->ecb).keys.m128[0];
        alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
        goto LAB_00116026;
      }
    }
    uVar13 = uVar9 + 1;
    lVar14 = 0x10;
    for (lVar15 = 0; uVar9 * 0x20 + lVar15 != 0; lVar15 = lVar15 + -0x20) {
      auVar21 = *(undefined1 (*) [16])((long)&(_ctx->ecb).keys + lVar14);
      auVar18 = aesenc(auVar19._0_16_,auVar21);
      auVar24 = aesenc(auVar25._0_16_,auVar21);
      auVar26 = aesenc(auVar27._0_16_,auVar21);
      auVar28 = aesenc(auVar29._0_16_,auVar21);
      auVar30 = aesenc(auVar31._0_16_,auVar21);
      auVar21 = aesenc(auVar22._0_16_,auVar21);
      gfmul_nextstep128(&gstate,*(__m128i *)((long)palVar10[-1] + lVar14),
                        (ptls_fusion_aesgcm_ghash_precompute128 *)
                        ((long)_ctx + lVar15 + lVar7 + -0x20));
      auVar22 = ZEXT1664(auVar21);
      auVar31 = ZEXT1664(auVar30);
      auVar29 = ZEXT1664(auVar28);
      auVar27 = ZEXT1664(auVar26);
      auVar25 = ZEXT1664(auVar24);
      auVar23 = ZEXT1664(_DAT_001236d0);
      auVar19 = ZEXT1664(auVar18);
      lVar14 = lVar14 + 0x10;
    }
    pauVar11 = (undefined1 (*) [16])((long)&(_ctx->ecb).keys + uVar9 * 0x10 + 0x10);
    auVar17 = ZEXT1664(local_198);
    uVar9 = uVar13;
    while( true ) {
      if (uVar8 <= uVar9) break;
      auVar21 = *pauVar11;
      auVar18 = aesenc(auVar19._0_16_,auVar21);
      auVar19._0_32_ = ZEXT1632(auVar18);
      auVar18 = aesenc(auVar25._0_16_,auVar21);
      auVar25._0_32_ = ZEXT1632(auVar18);
      auVar18 = aesenc(auVar27._0_16_,auVar21);
      auVar27._0_32_ = ZEXT1632(auVar18);
      auVar18 = aesenc(auVar29._0_16_,auVar21);
      auVar29._0_32_ = ZEXT1632(auVar18);
      auVar18 = aesenc(auVar31._0_16_,auVar21);
      auVar31._0_32_ = ZEXT1632(auVar18);
      auVar21 = aesenc(auVar22._0_16_,auVar21);
      auVar22._0_32_ = ZEXT1632(auVar21);
      uVar9 = uVar9 + 1;
      pauVar11 = pauVar11 + 1;
    }
    if (uVar13 <= uVar8) {
      uVar13 = uVar8;
    }
    alVar20 = (_ctx->ecb).keys.m128[uVar13];
    auVar21 = aesenclast(auVar19._0_16_,(undefined1  [16])alVar20);
    auVar19._0_32_ = ZEXT1632(auVar21);
    auVar24 = aesenclast(auVar25._0_16_,(undefined1  [16])alVar20);
    auVar25._0_32_ = ZEXT1632(auVar24);
    auVar26 = aesenclast(auVar27._0_16_,(undefined1  [16])alVar20);
    auVar27._0_32_ = ZEXT1632(auVar26);
    auVar28 = aesenclast(auVar29._0_16_,(undefined1  [16])alVar20);
    auVar29._0_32_ = ZEXT1632(auVar28);
    auVar30 = aesenclast(auVar31._0_16_,(undefined1  [16])alVar20);
    auVar31._0_32_ = ZEXT1632(auVar30);
    auVar18 = aesenclast(auVar22._0_16_,(undefined1  [16])alVar20);
    auVar22._0_32_ = ZEXT1632(auVar18);
    if ((lVar12 == 0) && (0x5f < inlen)) {
      *local_1d0 = (__m128i)(auVar21 ^ *local_1c0);
      local_1d0[1] = (__m128i)(auVar24 ^ local_1c0[1]);
      local_1d0[2] = (__m128i)(auVar26 ^ local_1c0[2]);
      local_1d0[3] = (__m128i)(auVar28 ^ local_1c0[3]);
      local_1d0[4] = (__m128i)(auVar30 ^ local_1c0[4]);
      local_1d0[5] = (__m128i)(auVar18 ^ local_1c0[5]);
      local_1d0 = local_1d0 + 6;
      local_1c0 = local_1c0 + 6;
      inlen = inlen - 0x60;
      goto LAB_0011657d;
    }
    if (bVar3) {
      local_d8 = auVar21;
    }
    bVar3 = false;
    lVar14 = 0;
    alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
    lVar6 = lVar7 + lVar15;
    palVar10 = (__m128i *)input;
    switch(lVar12) {
    case 0:
      goto switchD_001165a6_caseD_0;
    case 1:
      goto LAB_00116600;
    case 2:
      goto LAB_0011661e;
    case 3:
      goto LAB_0011663c;
    case 4:
      goto LAB_00116656;
    case 5:
      goto LAB_00116670;
    }
  } while( true );
switchD_001165a6_caseD_0:
  if (inlen < 0x11) {
LAB_001166c8:
    if (inlen != 0) {
      if (inlen == 0x10) {
        *local_1d0 = (__m128i)(auVar21 ^ *local_1c0);
      }
      else {
        loadn128(local_1c0,inlen);
        storen128(local_1d0,inlen,(__m128i)((undefined1  [16])alVar20 ^ auVar21));
      }
    }
    if (bVar4) {
      if (lVar7 + lVar15 != 0x240) {
        __assert_fail("ghash_precompute - 1 == ctx->ghash",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                      ,0x341,
                      "int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *, void *, const void *, size_t, __m128i, const void *, size_t, const void *)"
                     );
      }
      gfmul_nextstep128(&gstate,X,(ptls_fusion_aesgcm_ghash_precompute128 *)(_ctx + 1));
    }
    gfmul_reduce128(&gstate);
    auVar21._8_8_ = gstate.lo[1];
    auVar21._0_8_ = gstate.lo[0];
    auVar21 = vpshufb_avx(auVar21,_DAT_001236d0);
    return (int)((auVar21 ^ local_d8) == *_aad);
  }
  alVar20 = (__m128i)(auVar21 ^ *local_1c0);
  local_1c0 = local_1c0 + 1;
  *local_1d0 = alVar20;
  local_1d0 = local_1d0 + 1;
  inlen = inlen - 0x10;
LAB_00116600:
  auVar21 = auVar24;
  if (inlen < 0x11) goto LAB_001166c8;
  alVar20 = (__m128i)(auVar24 ^ *local_1c0);
  local_1c0 = local_1c0 + 1;
  *local_1d0 = alVar20;
  local_1d0 = local_1d0 + 1;
  inlen = inlen - 0x10;
LAB_0011661e:
  auVar21 = auVar26;
  if (inlen < 0x11) goto LAB_001166c8;
  alVar20 = (__m128i)(auVar26 ^ *local_1c0);
  local_1c0 = local_1c0 + 1;
  *local_1d0 = alVar20;
  local_1d0 = local_1d0 + 1;
  inlen = inlen - 0x10;
LAB_0011663c:
  auVar21 = auVar28;
  if (inlen < 0x11) goto LAB_001166c8;
  alVar20 = (__m128i)(auVar28 ^ *local_1c0);
  local_1c0 = local_1c0 + 1;
  *local_1d0 = alVar20;
  local_1d0 = local_1d0 + 1;
  inlen = inlen - 0x10;
LAB_00116656:
  auVar21 = auVar30;
  if (inlen < 0x11) goto LAB_001166c8;
  alVar20 = (__m128i)(auVar30 ^ *local_1c0);
  local_1c0 = local_1c0 + 1;
  *local_1d0 = alVar20;
  local_1d0 = local_1d0 + 1;
  inlen = inlen - 0x10;
LAB_00116670:
  auVar21 = auVar18;
  if (inlen < 0x11) goto LAB_001166c8;
  auVar21 = *local_1c0;
  local_1c0 = local_1c0 + 1;
  *local_1d0 = (__m128i)(auVar18 ^ auVar21);
  local_1d0 = local_1d0 + 1;
  inlen = inlen - 0x10;
LAB_0011657d:
  lVar6 = lVar7 + lVar15;
  lVar14 = 0;
  alVar20 = (__m128i)vpmovsxbq_avx(ZEXT216(1));
  goto LAB_00115f4d;
}

Assistant:

int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *_ctx, void *output, const void *input, size_t inlen, __m128i ctr,
                               const void *_aad, size_t aadlen, const void *tag)
{
    struct ptls_fusion_aesgcm_context128 *ctx = (void *)_ctx;
    __m128i ek0 = _mm_setzero_si128(), bits0, bits1 = _mm_setzero_si128(), bits2 = _mm_setzero_si128(), bits3 = _mm_setzero_si128(),
            bits4 = _mm_setzero_si128(), bits5 = _mm_setzero_si128();
    struct ptls_fusion_gfmul_state128 gstate = {0};
    __m128i gdatabuf[6];
    __m128i ac = _mm_shuffle_epi8(_mm_set_epi32(0, (int)aadlen * 8, 0, (int)inlen * 8), byteswap128);
    struct ptls_fusion_aesgcm_ghash_precompute128 *ghash_precompute = ctx->ghash + (aadlen + 15) / 16 + (inlen + 15) / 16 + 1;

    const __m128i *gdata; // points to the elements fed into GHASH
    size_t gdata_cnt;

    const __m128i *src_ghash = input, *src_aes = input, *aad = _aad;
    __m128i *dst = output;
    size_t nondata_aes_cnt = 0, src_ghashlen = inlen, src_aeslen = inlen;

    /* schedule ek0 and suppkey */
    ctr = _mm_add_epi64(ctr, one8);
    bits0 = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), ctx->super.ecb.keys.m128[0]);
    ++nondata_aes_cnt;

#define STATE_IS_FIRST_RUN 0x1
#define STATE_GHASH_HAS_MORE 0x2
    int state = STATE_IS_FIRST_RUN | STATE_GHASH_HAS_MORE;

    /* the main loop */
    while (1) {

        /* setup gdata */
        if (PTLS_UNLIKELY(aadlen != 0)) {
            gdata = gdatabuf;
            gdata_cnt = 0;
            while (gdata_cnt < 6) {
                if (aadlen < 16) {
                    if (aadlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(aad, aadlen);
                        aadlen = 0;
                        ++nondata_aes_cnt;
                    }
                    goto GdataFillSrc;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(aad++);
                aadlen -= 16;
                ++nondata_aes_cnt;
            }
        } else if (PTLS_LIKELY(src_ghashlen >= 6 * 16)) {
            gdata = src_ghash;
            gdata_cnt = 6;
            src_ghash += 6;
            src_ghashlen -= 6 * 16;
        } else {
            gdata = gdatabuf;
            gdata_cnt = 0;
        GdataFillSrc:
            while (gdata_cnt < 6) {
                if (src_ghashlen < 16) {
                    if (src_ghashlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(src_ghash, src_ghashlen);
                        src_ghash = (__m128i *)((uint8_t *)src_ghash + src_ghashlen);
                        src_ghashlen = 0;
                    }
                    if (gdata_cnt < 6 && (state & STATE_GHASH_HAS_MORE) != 0) {
                        gdatabuf[gdata_cnt++] = ac;
                        state &= ~STATE_GHASH_HAS_MORE;
                    }
                    break;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(src_ghash++);
                src_ghashlen -= 16;
            }
        }

        /* setup aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0))
            goto InitAllBits;
        switch (nondata_aes_cnt) {
#define INIT_BITS(n, keys)                                                                                                         \
    case n:                                                                                                                        \
        ctr = _mm_add_epi64(ctr, one8);                                                                                            \
        bits##n = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), keys.m128[0]);
        InitAllBits:
            INIT_BITS(0, ctx->super.ecb.keys);
            INIT_BITS(1, ctx->super.ecb.keys);
            INIT_BITS(2, ctx->super.ecb.keys);
            INIT_BITS(3, ctx->super.ecb.keys);
            INIT_BITS(4, ctx->super.ecb.keys);
            INIT_BITS(5, ctx->super.ecb.keys);
#undef INIT_BITS
        }

        { /* run aes and ghash */
#define AESECB6_UPDATE(i)                                                                                                          \
    do {                                                                                                                           \
        __m128i k = ctx->super.ecb.keys.m128[i];                                                                                   \
        bits0 = _mm_aesenc_si128(bits0, k);                                                                                        \
        bits1 = _mm_aesenc_si128(bits1, k);                                                                                        \
        bits2 = _mm_aesenc_si128(bits2, k);                                                                                        \
        bits3 = _mm_aesenc_si128(bits3, k);                                                                                        \
        bits4 = _mm_aesenc_si128(bits4, k);                                                                                        \
        bits5 = _mm_aesenc_si128(bits5, k);                                                                                        \
    } while (0)

            size_t aesi;
            for (aesi = 1; aesi <= gdata_cnt; ++aesi) {
                AESECB6_UPDATE(aesi);
                gfmul_nextstep128(&gstate, _mm_loadu_si128(gdata++), --ghash_precompute);
            }
            for (; aesi < ctx->super.ecb.rounds; ++aesi)
                AESECB6_UPDATE(aesi);
            __m128i k = ctx->super.ecb.keys.m128[aesi];
            bits0 = _mm_aesenclast_si128(bits0, k);
            bits1 = _mm_aesenclast_si128(bits1, k);
            bits2 = _mm_aesenclast_si128(bits2, k);
            bits3 = _mm_aesenclast_si128(bits3, k);
            bits4 = _mm_aesenclast_si128(bits4, k);
            bits5 = _mm_aesenclast_si128(bits5, k);

#undef AESECB6_UPDATE
        }

        /* apply aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0 && src_aeslen >= 6 * 16)) {
#define APPLY(i) _mm_storeu_si128(dst + i, _mm_xor_si128(_mm_loadu_si128(src_aes + i), bits##i))
            APPLY(0);
            APPLY(1);
            APPLY(2);
            APPLY(3);
            APPLY(4);
            APPLY(5);
#undef APPLY
            dst += 6;
            src_aes += 6;
            src_aeslen -= 6 * 16;
        } else {
            if ((state & STATE_IS_FIRST_RUN) != 0) {
                ek0 = bits0;
                state &= ~STATE_IS_FIRST_RUN;
            }
            switch (nondata_aes_cnt) {
#define APPLY(i)                                                                                                                   \
    case i:                                                                                                                        \
        if (PTLS_LIKELY(src_aeslen > 16)) {                                                                                        \
            _mm_storeu_si128(dst++, _mm_xor_si128(_mm_loadu_si128(src_aes++), bits##i));                                           \
            src_aeslen -= 16;                                                                                                      \
        } else {                                                                                                                   \
            bits0 = bits##i;                                                                                                       \
            goto Finish;                                                                                                           \
        }
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
            }
            nondata_aes_cnt = 0;
        }
    }

Finish:
    if (src_aeslen == 16) {
        _mm_storeu_si128(dst, _mm_xor_si128(_mm_loadu_si128(src_aes), bits0));
    } else if (src_aeslen != 0) {
        storen128(dst, src_aeslen, _mm_xor_si128(loadn128(src_aes, src_aeslen), bits0));
    }

    assert((state & STATE_IS_FIRST_RUN) == 0);

    /* the only case where AES operation is complete and GHASH is not is when the application of AC is remaining */
    if ((state & STATE_GHASH_HAS_MORE) != 0) {
        assert(ghash_precompute - 1 == ctx->ghash);
        gfmul_nextstep128(&gstate, ac, --ghash_precompute);
    }

    gfmul_reduce128(&gstate);
    __m128i calctag = gfmul_get_tag128(&gstate, ek0);

    return _mm_movemask_epi8(_mm_cmpeq_epi8(calctag, _mm_loadu_si128(tag))) == 0xffff;

#undef STATE_IS_FIRST_RUN
#undef STATE_GHASH_HAS_MORE
}